

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_get_shutdown(SSL *ssl)

{
  uint local_14;
  int ret;
  SSL *ssl_local;
  
  local_14 = 0;
  if (*(int *)(ssl->handshake_func + 0xac) != 0) {
    local_14 = 2;
  }
  if (*(int *)(ssl->handshake_func + 0xb0) == 1) {
    local_14 = local_14 | 1;
  }
  return local_14;
}

Assistant:

int SSL_get_shutdown(const SSL *ssl) {
  int ret = 0;
  if (ssl->s3->read_shutdown != ssl_shutdown_none) {
    // Historically, OpenSSL set |SSL_RECEIVED_SHUTDOWN| on both close_notify
    // and fatal alert.
    ret |= SSL_RECEIVED_SHUTDOWN;
  }
  if (ssl->s3->write_shutdown == ssl_shutdown_close_notify) {
    // Historically, OpenSSL set |SSL_SENT_SHUTDOWN| on only close_notify.
    ret |= SSL_SENT_SHUTDOWN;
  }
  return ret;
}